

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

const_iterator __thiscall
QHash<QGesture*,QHashDummyValue>::constFindImpl<QGesture*>
          (QHash<QGesture*,QHashDummyValue> *this,QGesture **key)

{
  Data<QHashPrivate::Node<QGesture*,QHashDummyValue>> *this_00;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar1;
  ulong uVar2;
  Bucket BVar3;
  const_iterator cVar4;
  
  this_00 = *(Data<QHashPrivate::Node<QGesture*,QHashDummyValue>> **)this;
  if ((this_00 != (Data<QHashPrivate::Node<QGesture*,QHashDummyValue>> *)0x0) &&
     (*(long *)(this_00 + 8) != 0)) {
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QHashDummyValue>>::findBucket<QGesture*>
                      (this_00,key);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pDVar1 = *(Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> **)this;
      uVar2 = ((long)BVar3.span - (long)pDVar1->spans) / 0x90 << 7 | BVar3.index;
      goto LAB_002daa84;
    }
  }
  uVar2 = 0;
  pDVar1 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
LAB_002daa84:
  cVar4.i.bucket = uVar2;
  cVar4.i.d = pDVar1;
  return (const_iterator)cVar4.i;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }